

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly.c
# Opt level: O1

void pair1poly_sock_init(void *arg,nni_sock *sock)

{
  nni_stat_item *item;
  nni_stat_item *item_00;
  nni_msgq *pnVar1;
  
  nni_id_map_init((nni_id_map *)((long)arg + 0x48),0,0,false);
  nni_list_init_offset((nni_list *)((long)arg + 0x80),0x738);
  *(nni_sock **)((long)arg + 0x10) = sock;
  nni_mtx_init((nni_mtx *)((long)arg + 0x20));
  nni_aio_init((nni_aio *)((long)arg + 0xa0),pair1poly_sock_get_cb,arg);
  item = (nni_stat_item *)((long)arg + 0x268);
  nni_stat_init(item,&pair1poly_sock_init::poly_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),item);
  item_00 = (nni_stat_item *)((long)arg + 0x2a8);
  nni_stat_init(item_00,&pair1poly_sock_init::raw_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),item_00);
  nni_stat_init((nni_stat_item *)((long)arg + 0x2e8),&pair1poly_sock_init::mismatch_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),(nni_stat_item *)((long)arg + 0x2e8));
  nni_stat_init((nni_stat_item *)((long)arg + 0x328),&pair1poly_sock_init::already_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),(nni_stat_item *)((long)arg + 0x328));
  nni_stat_init((nni_stat_item *)((long)arg + 0x368),&pair1poly_sock_init::ttl_drop_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),(nni_stat_item *)((long)arg + 0x368));
  nni_stat_init((nni_stat_item *)((long)arg + 0x428),&pair1poly_sock_init::tx_drop_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),(nni_stat_item *)((long)arg + 0x428));
  nni_stat_init((nni_stat_item *)((long)arg + 0x3a8),&pair1poly_sock_init::rx_malformed_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),(nni_stat_item *)((long)arg + 0x3a8));
  nni_stat_init((nni_stat_item *)((long)arg + 1000),&pair1poly_sock_init::tx_malformed_info);
  nni_sock_add_stat(*(nni_sock **)((long)arg + 0x10),(nni_stat_item *)((long)arg + 1000));
  nni_stat_set_bool(item_00,false);
  nni_stat_set_bool(item,true);
  pnVar1 = nni_sock_sendq(sock);
  *(nni_msgq **)arg = pnVar1;
  pnVar1 = nni_sock_recvq(sock);
  *(nni_msgq **)((long)arg + 8) = pnVar1;
  nni_atomic_init((nni_atomic_int *)((long)arg + 0x18));
  nni_atomic_set((nni_atomic_int *)((long)arg + 0x18),8);
  return;
}

Assistant:

static void
pair1poly_sock_init(void *arg, nni_sock *sock)
{
	pair1poly_sock *s = arg;

	nni_id_map_init(&s->pipes, 0, 0, false);
	NNI_LIST_INIT(&s->plist, pair1poly_pipe, node);
	s->sock = sock;

	// Raw mode uses this.
	nni_mtx_init(&s->mtx);

	nni_aio_init(&s->aio_get, pair1poly_sock_get_cb, s);

#ifdef NNG_ENABLE_STATS
	static const nni_stat_info poly_info = {
		.si_name = "poly",
		.si_desc = "polyamorous mode?",
		.si_type = NNG_STAT_BOOLEAN,
	};
	static const nni_stat_info raw_info = {
		.si_name = "raw",
		.si_desc = "raw mode?",
		.si_type = NNG_STAT_BOOLEAN,
	};
	static const nni_stat_info mismatch_info = {
		.si_name   = "mismatch",
		.si_desc   = "pipes rejected (protocol mismatch)",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info already_info = {
		.si_name   = "already",
		.si_desc   = "pipes rejected (already connected)",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info ttl_drop_info = {
		.si_name   = "ttl_drop",
		.si_desc   = "messages dropped due to too many hops",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info tx_drop_info = {
		.si_name   = "tx_drop",
		.si_desc   = "messages dropped undeliverable",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info rx_malformed_info = {
		.si_name   = "rx_malformed",
		.si_desc   = "malformed messages received",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info tx_malformed_info = {
		.si_name   = "tx_malformed",
		.si_desc   = "malformed messages not sent",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};

	pair1_add_sock_stat(s, &s->stat_poly, &poly_info);
	pair1_add_sock_stat(s, &s->stat_raw, &raw_info);
	pair1_add_sock_stat(s, &s->stat_reject_mismatch, &mismatch_info);
	pair1_add_sock_stat(s, &s->stat_reject_already, &already_info);
	pair1_add_sock_stat(s, &s->stat_ttl_drop, &ttl_drop_info);
	pair1_add_sock_stat(s, &s->stat_tx_drop, &tx_drop_info);
	pair1_add_sock_stat(s, &s->stat_rx_malformed, &rx_malformed_info);
	pair1_add_sock_stat(s, &s->stat_tx_malformed, &tx_malformed_info);

	nni_stat_set_bool(&s->stat_raw, false);
	nni_stat_set_bool(&s->stat_poly, true);
#endif

	s->uwq = nni_sock_sendq(sock);
	s->urq = nni_sock_recvq(sock);
	nni_atomic_init(&s->ttl);
	nni_atomic_set(&s->ttl, 8);
}